

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::ClientImpl::handle_request
          (ClientImpl *this,Stream *strm,Request *req,Response *res,bool close_connection,
          Error *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *username;
  size_t cnonce_count;
  char cVar2;
  bool bVar3;
  int iVar4;
  ssize_t sVar5;
  string *password;
  char *pcVar6;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t length;
  char *pcVar7;
  string *cnonce;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  auth;
  string local_618;
  Response new_res;
  Request req2;
  Request req_save;
  
  if ((req->path)._M_string_length == 0) {
    *error = Connection;
    cVar2 = '\0';
  }
  else {
    Request::Request(&req_save,req);
    iVar4 = (*this->_vptr_ClientImpl[6])(this);
    if ((((char)iVar4 == '\0') && ((this->proxy_host_)._M_string_length != 0)) &&
       (this->proxy_port_ != -1)) {
      Request::Request(&req2,req);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&auth,
                     "http://",&this->host_and_port_);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&auth,
                 (req->path)._M_dataplus._M_p,(req->path)._M_string_length);
      handle_request();
      cVar2 = process_request(this,strm,&req2,res,close_connection,error);
      Request::operator=(req,&req2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&req->path,&req_save.path);
      Request::~Request(&req2);
    }
    else {
      cVar2 = process_request(this,strm,req,res,close_connection,error);
    }
    if ((bool)cVar2 == false) {
      cVar2 = '\0';
    }
    else {
      if ((res->status - 0x12dU < 99) && (this->follow_location_ == true)) {
        Request::operator=(req,&req_save);
        cVar2 = redirect(this,req,res,error);
      }
      iVar4 = res->status;
      if (((iVar4 == 0x197) || (iVar4 == 0x191)) && (req->authorization_count_ < 5)) {
        username = &this->proxy_digest_auth_username_;
        password = &this->proxy_digest_auth_password_;
        if (iVar4 != 0x197) {
          password = &this->digest_auth_password_;
          username = &this->digest_auth_username_;
        }
        if ((username->_M_string_length != 0) && (password->_M_string_length != 0)) {
          auth._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &auth._M_t._M_impl.super__Rb_tree_header._M_header;
          auth._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          auth._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          auth._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          auth._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               auth._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar3 = detail::parse_www_authenticate(res,&auth,iVar4 == 0x197);
          if (bVar3) {
            Request::Request(&req2,req);
            pcVar7 = "Authorization";
            if (iVar4 == 0x197) {
              pcVar7 = "Proxy-Authorization";
            }
            pcVar6 = pcVar7 + 0xd;
            if (iVar4 == 0x197) {
              pcVar6 = pcVar7 + 0x13;
            }
            req2.authorization_count_ = req2.authorization_count_ + 1;
            paVar1 = &new_res.version.field_2;
            new_res.version._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&new_res,pcVar7,pcVar6);
            std::
            multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::erase(&req2.headers,&new_res.version);
            length = extraout_RDX;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)new_res.version._M_dataplus._M_p != paVar1) {
              operator_delete(new_res.version._M_dataplus._M_p,
                              CONCAT71(new_res.version.field_2._M_allocated_capacity._1_7_,
                                       new_res.version.field_2._M_local_buf[0]) + 1);
              length = extraout_RDX_00;
            }
            cnonce_count = req2.authorization_count_;
            detail::random_string_abi_cxx11_(&local_618,(detail *)0xa,length);
            cnonce = &local_618;
            detail::make_digest_authentication_header
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&new_res,req,&auth,cnonce_count,cnonce,username,password,iVar4 == 0x197);
            iVar4 = (int)cnonce;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&req2.headers,
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&new_res);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&new_res);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_618._M_dataplus._M_p != &local_618.field_2) {
              operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1
                             );
            }
            new_res.reason._M_dataplus._M_p = (pointer)&new_res.reason.field_2;
            new_res.version._M_string_length = 0;
            new_res.version.field_2._M_local_buf[0] = '\0';
            new_res.status = -1;
            new_res.reason._M_string_length = 0;
            new_res.reason.field_2._M_local_buf[0] = '\0';
            new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header;
            new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            new_res.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            new_res.body._M_dataplus._M_p = (pointer)&new_res.body.field_2;
            new_res.body._M_string_length = 0;
            new_res.body.field_2._M_local_buf[0] = '\0';
            new_res.location._M_dataplus._M_p = (pointer)&new_res.location.field_2;
            new_res.location._M_string_length = 0;
            new_res.location.field_2._M_local_buf[0] = '\0';
            new_res.content_length_ = 0;
            new_res.content_provider_.super__Function_base._M_functor._M_unused._M_object =
                 (void *)0x0;
            new_res.content_provider_.super__Function_base._M_functor._8_8_ = 0;
            new_res.content_provider_.super__Function_base._M_manager = (_Manager_type)0x0;
            new_res.content_provider_._M_invoker = (_Invoker_type)0x0;
            new_res.content_provider_resource_releaser_.super__Function_base._M_functor._M_unused.
            _M_object = (void *)0x0;
            new_res.content_provider_resource_releaser_.super__Function_base._M_functor._8_8_ = 0;
            new_res.content_provider_resource_releaser_.super__Function_base._M_manager._0_2_ = 0;
            new_res.content_provider_resource_releaser_.super__Function_base._M_manager._2_6_ = 0;
            new_res.content_provider_resource_releaser_._M_invoker._0_2_ = 0;
            new_res._250_8_ = 0;
            new_res.version._M_dataplus._M_p = (pointer)&new_res.version.field_2;
            new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            sVar5 = send(this,(int)&req2,&new_res,(size_t)error,iVar4);
            cVar2 = (char)sVar5;
            if (cVar2 != '\0') {
              Response::operator=(res,&new_res);
            }
            Response::~Response(&new_res);
            Request::~Request(&req2);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&auth._M_t);
        }
      }
    }
    Request::~Request(&req_save);
  }
  return (bool)cVar2;
}

Assistant:

inline bool ClientImpl::handle_request(Stream &strm, Request &req,
                                       Response &res, bool close_connection,
                                       Error &error) {
  if (req.path.empty()) {
    error = Error::Connection;
    return false;
  }

  auto req_save = req;

  bool ret;

  if (!is_ssl() && !proxy_host_.empty() && proxy_port_ != -1) {
    auto req2 = req;
    req2.path = "http://" + host_and_port_ + req.path;
    ret = process_request(strm, req2, res, close_connection, error);
    req = req2;
    req.path = req_save.path;
  } else {
    ret = process_request(strm, req, res, close_connection, error);
  }

  if (!ret) { return false; }

  if (300 < res.status && res.status < 400 && follow_location_) {
    req = req_save;
    ret = redirect(req, res, error);
  }

#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
  if ((res.status == 401 || res.status == 407) &&
      req.authorization_count_ < 5) {
    auto is_proxy = res.status == 407;
    const auto &username =
        is_proxy ? proxy_digest_auth_username_ : digest_auth_username_;
    const auto &password =
        is_proxy ? proxy_digest_auth_password_ : digest_auth_password_;

    if (!username.empty() && !password.empty()) {
      std::map<std::string, std::string> auth;
      if (detail::parse_www_authenticate(res, auth, is_proxy)) {
        Request new_req = req;
        new_req.authorization_count_ += 1;
        new_req.headers.erase(is_proxy ? "Proxy-Authorization"
                                       : "Authorization");
        new_req.headers.insert(detail::make_digest_authentication_header(
            req, auth, new_req.authorization_count_, detail::random_string(10),
            username, password, is_proxy));

        Response new_res;

        ret = send(new_req, new_res, error);
        if (ret) { res = new_res; }
      }
    }
  }
#endif

  return ret;
}